

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O2

bool __thiscall S2CellId::contains(S2CellId *this,S2CellId other)

{
  ulong uVar1;
  S2LogMessage SStack_18;
  
  uVar1 = this->id_;
  if (((uint)(uVar1 >> 0x3e) < 3) && ((uVar1 & 0x1555555555555555 & -uVar1) != 0)) {
    if ((other.id_ < 0xc000000000000000) && ((-other.id_ & 0x1555555555555555 & other.id_) != 0)) {
      return other.id_ <= (uVar1 - 1 | uVar1) && uVar1 - (~uVar1 & uVar1 - 1) <= other.id_;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,599,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: other.is_valid() ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
               ,0x256,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: is_valid() ");
  }
  abort();
}

Assistant:

inline int S2CellId::face() const {
  return id_ >> kPosBits;
}